

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  TestEventRepeater *pTVar2;
  pointer ppTVar3;
  pointer piVar4;
  long lVar5;
  long lVar6;
  __time_t _Var7;
  bool bVar8;
  int iVar9;
  pointer ppTVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  byte bVar14;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  pointer ppEVar15;
  uint uVar16;
  ulong uVar17;
  pointer ppEVar18;
  long lVar19;
  undefined1 local_60 [8];
  timeval now;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_60,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&g_argvs_abi_cxx11_);
  _Var7 = now.tv_sec;
  lVar5 = CONCAT44(local_60._4_4_,local_60._0_4_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  if (g_help_flag == '\0') {
    PostFlagParsingInit(this);
    WriteToShardStatusFileIfNeeded();
    pIVar1 = (this->internal_run_death_test_flag_).ptr_;
    bVar8 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                        pIVar1 != (InternalRunDeathTestFlag *)0x0);
    iVar9 = FilterTests(this,(uint)!bVar8);
    if (FLAGS_gtest_list_tests != '\x01') {
      iVar11 = 0;
      if (FLAGS_gtest_shuffle == '\x01') {
        iVar11 = FLAGS_gtest_random_seed;
        if (FLAGS_gtest_random_seed == 0) {
          gettimeofday((timeval *)local_60,(__timezone_ptr_t)0x0);
          iVar11 = ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(now.tv_sec),8) >> 7) -
                   (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(now.tv_sec),0xc) >> 0x1f)) +
                   local_60._0_4_ * 1000;
        }
        iVar11 = (iVar11 - 1U) % 99999 + 1;
      }
      this->random_seed_ = iVar11;
      pTVar2 = (this->listeners_).repeater_;
      gettimeofday((timeval *)local_60,(__timezone_ptr_t)0x0);
      this->start_timestamp_ = now.tv_sec / 1000 + CONCAT44(local_60._4_4_,local_60._0_4_) * 1000;
      (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[2])(pTVar2);
      uVar12 = 1;
      if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
        uVar12 = FLAGS_gtest_repeat;
      }
      if (uVar12 == 0) {
        bVar8 = true;
      }
      else {
        uVar17 = 0;
        bVar14 = 0;
        do {
          ppTVar3 = (this->test_cases_).
                    super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppTVar10 = (this->test_cases_).
                          super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppTVar10 != ppTVar3;
              ppTVar10 = ppTVar10 + 1) {
            TestCase::ClearResult(*ppTVar10);
          }
          gettimeofday((timeval *)local_60,(__timezone_ptr_t)0x0);
          lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(now.tv_sec),8);
          lVar6 = CONCAT44(local_60._4_4_,local_60._0_4_);
          if (iVar9 < 1) {
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                      (pTVar2,this->parent_,uVar17);
          }
          else {
            if (FLAGS_gtest_shuffle == '\x01') {
              (this->random_).state_ = this->random_seed_;
              ShuffleTests(this);
            }
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                      (pTVar2,this->parent_,uVar17);
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[4])(pTVar2,this->parent_);
            ppEVar15 = (this->environments_).
                       super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            for (ppEVar18 = (this->environments_).
                            super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppEVar18 != ppEVar15;
                ppEVar18 = ppEVar18 + 1) {
              (**(code **)(*(long *)*ppEVar18 + 0x10))();
            }
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[5])(pTVar2,this->parent_);
            bVar8 = Test::HasFatalFailure();
            if ((!bVar8) &&
               (ppTVar10 = (this->test_cases_).
                           super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,
               0 < (int)((ulong)((long)(this->test_cases_).
                                       super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar10)
                        >> 3))) {
              lVar19 = 0;
              do {
                piVar4 = (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                uVar16 = 0xffffffff;
                if (lVar19 < (int)((ulong)((long)(this->test_case_indices_).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                          (long)piVar4) >> 2)) {
                  uVar16 = piVar4[lVar19];
                }
                TestCase::Run(ppTVar10[uVar16]);
                lVar19 = lVar19 + 1;
                ppTVar10 = (this->test_cases_).
                           super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              } while (lVar19 < (int)((ulong)((long)(this->test_cases_).
                                                                                                        
                                                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)ppTVar10) >> 3));
            }
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xb])(pTVar2,this->parent_);
            ppEVar18 = (this->environments_).
                       super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            for (ppEVar15 = (this->environments_).
                            super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish; ppEVar15 != ppEVar18;
                ppEVar15 = ppEVar15 + -1) {
              (**(code **)(*(long *)ppEVar15[-1] + 0x18))();
            }
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar2);
          }
          gettimeofday((timeval *)local_60,(__timezone_ptr_t)0x0);
          this->elapsed_time_ =
               (CONCAT44(local_60._4_4_,local_60._0_4_) - lVar6) * 1000 +
               now.tv_sec / 1000 + ((lVar13 >> 7) - (lVar13 >> 0x3f));
          (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xd])
                    (pTVar2,this->parent_,uVar17);
          bVar8 = Passed(this);
          if (!bVar8) {
            bVar14 = 1;
          }
          UnshuffleTests(this);
          if (FLAGS_gtest_shuffle == '\x01') {
            iVar11 = GetNextRandomSeed(this->random_seed_);
            this->random_seed_ = iVar11;
          }
          uVar16 = (int)uVar17 + 1;
          uVar17 = (ulong)uVar16;
        } while (uVar16 != uVar12 || (int)uVar12 < 0);
        bVar8 = (bool)(bVar14 ^ 1);
      }
      (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar2,this->parent_);
      if (_Var7 != lVar5) {
        return bVar8;
      }
      ColoredPrintf(COLOR_RED,
                    "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                   );
      return bVar8;
    }
    ListTestsMatchingFilter(this);
  }
  return true;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True iff Google Test is initialized before RUN_ALL_TESTS() is called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag)
    return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();

  // True iff we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#if GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test = (internal_run_death_test_flag_.get() != NULL);
# if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
# endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run = FilterTests(should_shard
                                              ? HONOR_SHARDING_PROTOCOL
                                              : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GTEST_FLAG(shuffle) ?
      GetRandomSeedFromFlag(GTEST_FLAG(random_seed)) : 0;

  // True iff at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG(repeat);
  // Repeats forever if the repeat count is negative.
  const bool forever = repeat < 0;
  for (int i = 0; forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    const TimeInMillis start = GetTimeInMillis();

    // Shuffles test cases and tests if requested.
    if (has_tests_to_run && GTEST_FLAG(shuffle)) {
      random()->Reseed(random_seed_);
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test case if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand.
      repeater->OnEnvironmentsSetUpStart(*parent_);
      ForEach(environments_, SetUpEnvironment);
      repeater->OnEnvironmentsSetUpEnd(*parent_);

      // Runs the tests only if there was no fatal failure during global
      // set-up.
      if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_case_count();
             test_index++) {
          GetMutableTestCase(test_index)->Run();
        }
      }

      // Tears down all environments in reverse order afterwards.
      repeater->OnEnvironmentsTearDownStart(*parent_);
      std::for_each(environments_.rbegin(), environments_.rend(),
                    TearDownEnvironment);
      repeater->OnEnvironmentsTearDownEnd(*parent_);
    }

    elapsed_time_ = GetTimeInMillis() - start;

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        COLOR_RED,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
#if GTEST_FOR_GOOGLE_
    ColoredPrintf(COLOR_RED,
                  "For more details, see http://wiki/Main/ValidGUnitMain.\n");
#endif  // GTEST_FOR_GOOGLE_
  }

  return !failed;
}